

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O1

bool tinyusdz::io::MMapFile(string *filepath,MMapFileHandle *handle,bool writable,string *err)

{
  int iVar1;
  FILE *__stream;
  size_t __len;
  uint8_t *puVar2;
  undefined7 in_register_00000011;
  char *__modes;
  
  __modes = "r";
  if ((int)CONCAT71(in_register_00000011,writable) != 0) {
    __modes = "rw";
  }
  __stream = fopen((filepath->_M_dataplus)._M_p,__modes);
  if (__stream != (FILE *)0x0) {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 != 0) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::append((char *)err);
      }
      fclose(__stream);
      return false;
    }
    __len = ftell(__stream);
    fseek(__stream,0,0);
    if (__len != 0) {
      iVar1 = fileno(__stream);
      puVar2 = (uint8_t *)mmap((void *)0x0,__len,(uint)writable * 2 + 1,2,iVar1,0);
      if (puVar2 != (uint8_t *)0xffffffffffffffff) {
        handle->addr = puVar2;
        handle->size = __len;
        handle->writable = writable;
        ::std::__cxx11::string::_M_assign((string *)handle);
        close(iVar1);
        return true;
      }
    }
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool MMapFile(const std::string &filepath, MMapFileHandle *handle, bool writable, std::string *err) {

#if TINYUSDZ_MMAP_SUPPORTED
#if defined(_WIN32)
  //int fd = open(filepath.c_str(), writable ? O_RDWR : O_RDONLY);

  std::wstring unicode_filepath = UTF8ToWchar(filepath);
  HANDLE hFile = CreateFileW(unicode_filepath.c_str(), GENERIC_READ, FILE_SHARE_READ, nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, nullptr);
  if (hFile == INVALID_HANDLE_VALUE) {
    if (err) {
      (*err) += "Failed to open file.";
    }
    return false;
  }

  if (!MMapFileImplWin32(hFile, handle, writable, err)) {
    return false;
  }

  handle->filename = filepath;
  handle->unicode_filename = unicode_filepath;

  return true;

#else   // !WIN32
  // assume posix
  FILE *fp = fopen(filepath.c_str(), writable ? "rw" : "r");
  if (!fp) {
    if (err) {
      (*err) += "fopen failed.";
    }
    return false;
  }

  int ret = std::fseek(fp, 0, SEEK_END);
  if (ret != 0) {
    if (err) {
      (*err) += "Failed to fseek.";
    }
    fclose(fp);
    return false;
  }

  size_t size = size_t(std::ftell(fp));
  std::fseek(fp, 0, SEEK_SET);

  if (size == 0) {
    if (err) {
      (*err) += "File size is zero.";
    }
    return false;
  }

  int fd = fileno(fp);

  int flags = MAP_PRIVATE;  // delayed access
  void *addr =
      mmap(nullptr, size, writable ? PROT_READ | PROT_WRITE : PROT_READ, flags,
           fd, 0);
  if (addr == MAP_FAILED) {
    if (err) {
      (*err) += "mmap failed.";
    }
    return false;
  }

  handle->addr = reinterpret_cast<uint8_t *>(addr);
  handle->size = uint64_t(size);
  handle->writable = writable;
  handle->filename = filepath;
  close(fd);

  return true;
#endif  // !WIN32
#else   // !TINYUSDZ_MMAP_SUPPORTED
  (void)filepath;
  (void)handle;
  (void)writable;
  (void)err;
  return false;
#endif
}